

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O1

bool __thiscall
Js::PathTypeHandlerBase::TryGetFixedProperty<true,false>
          (PathTypeHandlerBase *this,PropertyRecord *propertyRecord,Var *pProperty,
          FixedPropertyKind propertyType,ScriptContext *requestContext)

{
  bool bVar1;
  PropertyIndex index;
  int iVar2;
  undefined4 extraout_var;
  RecyclableObject *obj;
  
  if ((DAT_015d6361 == '\x01') &&
     (index = TypePath::Lookup((this->typePath).ptr,propertyRecord->pid,
                               (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1)),
     index != 0xffff)) {
    iVar2 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6b])(this);
    if (((CONCAT44(extraout_var,iVar2) == 0) ||
        ((*(byte *)(CONCAT44(extraout_var,iVar2) + (ulong)index) & 0x18) == 0)) &&
       ((obj = (RecyclableObject *)
               TypePath::GetSingletonFixedFieldAt
                         ((this->typePath).ptr,index,
                          (uint)((this->super_DynamicTypeHandler).unusedBytes >> 1),requestContext),
        obj != (RecyclableObject *)0x0 &&
        ((((bVar1 = DynamicTypeHandler::IsFixedMethodProperty
                              (&this->super_DynamicTypeHandler,propertyType),
           (ulong)obj >> 0x30 == 0 && (bVar1)) &&
          (bVar1 = VarIsImpl<Js::JavascriptFunction>(obj), bVar1)) ||
         (bVar1 = DynamicTypeHandler::IsFixedDataProperty
                            (&this->super_DynamicTypeHandler,propertyType), bVar1)))))) {
      *pProperty = obj;
      return true;
    }
  }
  return false;
}

Assistant:

bool PathTypeHandlerBase::TryGetFixedProperty(PropertyRecord const * propertyRecord, Var * pProperty, Js::FixedPropertyKind propertyType, ScriptContext * requestContext)
    {
        if (!FixPropsOnPathTypes())
        {
            return false;
        }

        PropertyIndex index = this->GetTypePath()->Lookup(propertyRecord->GetPropertyId(), GetPathLength());
        if (index == Constants::NoSlot)
        {
            AssertMsg(allowNonExistent, "Trying to get a fixed function instance for a non-existent property?");
            return false;
        }

        ObjectSlotAttributes * attributes = this->GetAttributeArray();
        ObjectSlotAttributes attr = attributes ? attributes[index] : ObjectSlotAttr_Default;
        if (attr & (ObjectSlotAttr_Deleted | ObjectSlotAttr_Accessor))
        {
            return false;
        }

        Var value = this->GetTypePath()->GetSingletonFixedFieldAt(index, GetPathLength(), requestContext);
        if (value && ((IsFixedMethodProperty(propertyType) && VarIs<JavascriptFunction>(value)) || IsFixedDataProperty(propertyType)))
        {
            *pProperty = value;
            if (markAsUsed)
            {
                this->GetTypePath()->SetIsUsedFixedFieldAt(index, GetPathLength());
            }
            return true;
        }
        else
        {
            return false;
        }
    }